

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProjectSettings.cpp
# Opt level: O3

Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* ProjectSettings::readFromFile_abi_cxx11_(char *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 __rhs;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  string *psVar10;
  path *__lhs;
  FILE *__stream;
  ulong uVar11;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rVar12;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rVar13;
  reference_wrapper<const_yaml::Mapping> rVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  char *filename_00;
  yaml *in_RSI;
  Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  size_t sVar16;
  ExpectedRef<const_Mapping,_std::string> automation;
  ExpectedRef<const_std::string,_std::string> type;
  ExpectedRef<const_std::string,_std::string> filename_1;
  string raw_file;
  ExpectedRef<const_Mapping,_std::string> map_audio_result;
  ExpectedRef<const_Mapping,_std::string> map_video_result;
  ProjectSettings settings;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  samplerate_result;
  ExpectedRef<const_std::string,_std::string> video_config_result;
  ExpectedRef<const_Mapping,_std::string> config_result;
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  top_result;
  undefined1 local_370 [32];
  bool local_350;
  undefined1 local_330 [32];
  bool local_310;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [48];
  undefined1 local_2b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 local_270 [32];
  char local_250;
  undefined1 local_248 [32];
  char local_228;
  undefined1 local_220 [72];
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  long local_150;
  undefined1 local_148 [32];
  bool local_128;
  undefined1 local_120 [32];
  bool local_100;
  char *local_f8;
  undefined1 local_f0 [32];
  char local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  anon_union_112_2_9b3c4038_for_Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_a8;
  char local_38;
  
  aAppDebugPrintf("Reading project settings from file %s");
  yaml::parse_abi_cxx11_
            ((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8.value_,in_RSI,filename_00);
  if (local_38 == '\0') {
    local_220._0_8_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_220 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_220,local_a8.error_.error_._M_dataplus._M_p,
               (pointer)(local_a8.error_.error_._M_string_length +
                        (long)local_a8.error_.error_._M_dataplus._M_p));
    paVar1 = &(in_RDI->field_0).value_.video.config_filename.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&in_RDI->field_0 = paVar1;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_220 + 0x10)) {
      paVar1->_M_allocated_capacity = local_220._16_8_;
      *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
           local_220._24_8_;
    }
    else {
      (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p = (pointer)local_220._0_8_;
      (in_RDI->field_0).value_.video.config_filename.field_2._M_allocated_capacity =
           local_220._16_8_;
    }
    (in_RDI->field_0).value_.video.config_filename._M_string_length = local_220._8_8_;
    in_RDI->has_value_ = false;
    goto LAB_00128081;
  }
  yaml::Value::getMapping_abi_cxx11_
            ((ExpectedRef<const_Mapping,_std::string> *)
             &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                *)local_f0)->value_,&local_a8.value_);
  uVar5 = local_f0._0_8_;
  if (local_d0 == '\0') {
    local_370._0_8_ = (Mapping *)(local_370 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_370,"Top config entity is not an ojbect","");
    if ((Mapping *)local_370._0_8_ == (Mapping *)(local_370 + 0x10)) {
      local_220._24_8_ = local_370._24_8_;
      rVar14._M_data = (Mapping *)(local_220 + 0x10);
    }
    else {
      local_220._0_8_ = local_370._0_8_;
      rVar14._M_data = (Mapping *)local_370._0_8_;
    }
    local_220._16_8_ = local_370._16_8_;
    paVar1 = &(in_RDI->field_0).value_.video.config_filename.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&in_RDI->field_0 = paVar1;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar14._M_data ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_220 + 0x10)) {
      paVar1->_M_allocated_capacity = local_370._16_8_;
      *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
           local_220._24_8_;
    }
    else {
      (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p = (pointer)rVar14._M_data;
      (in_RDI->field_0).value_.video.config_filename.field_2._M_allocated_capacity =
           local_370._16_8_;
    }
    (in_RDI->field_0).value_.video.config_filename._M_string_length = local_370._8_8_;
    in_RDI->has_value_ = false;
  }
  else {
    local_220._8_8_ = 0;
    local_220._16_8_ = local_220._16_8_ & 0xffffffffffffff00;
    local_220._32_4_ = 0;
    local_220._36_4_ = 0;
    local_220._40_8_ = 0;
    local_220._48_4_ = 0x10;
    local_220._56_8_ = (float *)0x0;
    local_220._64_4_ = None;
    local_1d8._M_p = (pointer)&local_1c8;
    local_1d0 = 0;
    local_1c8._M_local_buf[0] = '\0';
    local_1b8._0_4_ = 0x780;
    local_1b8._4_4_ = 0x438;
    local_1b0._M_p = (pointer)&local_1a0;
    local_1a0._M_allocated_capacity = 0x632e74726f707865;
    local_1a8 = 8;
    local_1a0._M_local_buf[8] = '\0';
    local_190._M_p = (pointer)&local_180;
    local_188 = 0;
    local_180._M_local_buf[0] = '\0';
    local_170._M_p = (pointer)&local_160;
    local_168 = 0;
    local_160._M_local_buf[0] = '\0';
    rVar14._M_data = (Mapping *)(local_370 + 0x10);
    local_370._0_8_ = rVar14._M_data;
    local_220._0_8_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_220 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"video","");
    yaml::Mapping::getMapping
              ((ExpectedRef<const_Mapping,_std::string> *)
               &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                  *)local_248)->value_,(Mapping *)uVar5,(string *)local_370);
    if ((Mapping *)local_370._0_8_ != rVar14._M_data) {
      operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
    }
    uVar4 = local_248._0_8_;
    if (local_228 == '\0') {
      local_370._0_8_ = rVar14._M_data;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_370,local_248._0_8_,local_248._8_8_ + local_248._0_8_);
      paVar1 = &(in_RDI->field_0).value_.video.config_filename.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&in_RDI->field_0 = paVar1;
      if ((Mapping *)local_370._0_8_ == rVar14._M_data) {
        paVar1->_M_allocated_capacity = local_370._16_8_;
        *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
             local_370._24_8_;
      }
      else {
        *(undefined8 *)&in_RDI->field_0 = local_370._0_8_;
        (in_RDI->field_0).value_.video.config_filename.field_2._M_allocated_capacity =
             local_370._16_8_;
      }
      (in_RDI->field_0).value_.video.config_filename._M_string_length = local_370._8_8_;
      in_RDI->has_value_ = false;
    }
    else {
      local_370._0_8_ = rVar14._M_data;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"config_file","");
      yaml::Mapping::getString
                ((ExpectedRef<const_std::string,_std::string> *)local_120,(Mapping *)uVar4,
                 (string *)local_370);
      if ((Mapping *)local_370._0_8_ != rVar14._M_data) {
        operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
      }
      if (local_100 == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330,"Cannot read video config: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_330 + 0x10))
        {
          local_370._24_8_ = local_330._24_8_;
          rVar12._M_data =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar14._M_data;
        }
        else {
          local_370._0_8_ = local_330._0_8_;
          rVar12._M_data =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_;
        }
        paVar1 = &(in_RDI->field_0).value_.video.config_filename.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&in_RDI->field_0 = paVar1;
        if (rVar12._M_data ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar14._M_data) {
          paVar1->_M_allocated_capacity = local_330._16_8_;
          *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
               local_370._24_8_;
        }
        else {
          (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p = (pointer)rVar12._M_data;
          (in_RDI->field_0).value_.video.config_filename.field_2._M_allocated_capacity =
               local_330._16_8_;
        }
        (in_RDI->field_0).value_.video.config_filename._M_string_length = local_330._8_8_;
        in_RDI->has_value_ = false;
      }
      else {
        std::__cxx11::string::_M_assign((string *)local_220);
        rVar14._M_data = (Mapping *)(local_370 + 0x10);
        local_370._0_8_ = rVar14._M_data;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"audio","");
        yaml::Mapping::getMapping
                  ((ExpectedRef<const_Mapping,_std::string> *)
                   &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                      *)local_270)->value_,(Mapping *)uVar5,(string *)local_370);
        if ((Mapping *)local_370._0_8_ != rVar14._M_data) {
          operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
        }
        uVar4 = local_270._0_8_;
        if (local_250 == '\0') {
          local_370._0_8_ = rVar14._M_data;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_370,local_270._0_8_,local_270._8_8_ + local_270._0_8_);
          paVar1 = &(in_RDI->field_0).value_.video.config_filename.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&in_RDI->field_0 = paVar1;
          if ((Mapping *)local_370._0_8_ == rVar14._M_data) {
            paVar1->_M_allocated_capacity = local_370._16_8_;
            *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
                 local_370._24_8_;
          }
          else {
            *(undefined8 *)&in_RDI->field_0 = local_370._0_8_;
            (in_RDI->field_0).value_.video.config_filename.field_2._M_allocated_capacity =
                 local_370._16_8_;
          }
          (in_RDI->field_0).value_.video.config_filename._M_string_length = local_370._8_8_;
          in_RDI->has_value_ = false;
        }
        else {
          local_370._0_8_ = rVar14._M_data;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"samplerate","");
          yaml::Mapping::getInt
                    ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_148,(Mapping *)uVar4,(string *)local_370);
          if ((Mapping *)local_370._0_8_ != rVar14._M_data) {
            operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
          }
          if (local_128 == false) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_330,"Error reading samplerate: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_330 + 0x10)) {
              local_370._24_8_ = local_330._24_8_;
              rVar12._M_data =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   rVar14._M_data;
            }
            else {
              local_370._0_8_ = local_330._0_8_;
              rVar12._M_data =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_330._0_8_;
            }
            paVar1 = &(in_RDI->field_0).value_.video.config_filename.field_2;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)&in_RDI->field_0 = paVar1;
            if (rVar12._M_data ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar14._M_data)
            {
              paVar1->_M_allocated_capacity = local_330._16_8_;
              *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
                   local_370._24_8_;
            }
            else {
              (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p =
                   (pointer)rVar12._M_data;
              (in_RDI->field_0).value_.video.config_filename.field_2._M_allocated_capacity =
                   local_330._16_8_;
            }
            (in_RDI->field_0).value_.video.config_filename._M_string_length = local_330._8_8_;
            in_RDI->has_value_ = false;
          }
          else {
            local_220._32_4_ = local_148._0_4_;
            local_370._0_8_ = local_370 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"channels","");
            lVar8 = yaml::Mapping::getInt((Mapping *)uVar4,(string *)local_370,2);
            local_220._36_4_ = (int)lVar8;
            if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
              operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
            }
            local_370._0_8_ = local_370 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"duration_sec","");
            local_150 = yaml::Mapping::getInt((Mapping *)uVar4,(string *)local_370,0x78);
            if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
              operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
            }
            local_370._0_8_ = local_370 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"bpm","");
            lVar8 = yaml::Mapping::getInt((Mapping *)uVar4,(string *)local_370,0x3c);
            if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
              operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
            }
            local_370._0_8_ = local_370 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"rows_per_beat","");
            lVar9 = yaml::Mapping::getInt((Mapping *)uVar4,(string *)local_370,8);
            if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
              operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
            }
            local_370._0_8_ = local_370 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"raw_file","");
            local_330._0_8_ = local_330 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
            psVar10 = yaml::Mapping::getString
                                ((Mapping *)uVar4,(string *)local_370,(string *)local_330);
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            pcVar3 = (psVar10->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_290,pcVar3,pcVar3 + psVar10->_M_string_length);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_330 + 0x10)) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
              operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
            }
            local_220._40_8_ =
                 (ulong)(uint)((local_220._32_4_ * 0x3c) / ((int)lVar9 * (int)lVar8)) << 0x20;
            if (local_290._M_string_length != 0) {
              std::experimental::filesystem::v1::__cxx11::path::
              path<char_const*,std::experimental::filesystem::v1::__cxx11::path>
                        ((path *)local_330,&local_f8);
              __lhs = (path *)std::experimental::filesystem::v1::__cxx11::path::remove_filename
                                        ((path *)local_330);
              std::experimental::filesystem::v1::__cxx11::path::
              path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                        ((path *)local_2f0,&local_290);
              std::experimental::filesystem::v1::__cxx11::operator/
                        ((path *)local_370,__lhs,(path *)local_2f0);
              local_2b0._0_8_ = local_2b0 + 0x10;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)local_2b0,local_370._0_8_,
                         (pointer)(local_370._8_8_ + local_370._0_8_));
              __stream = fopen((char *)local_2b0._0_8_,"rb");
              if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
              }
              std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_370);
              std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_2f0);
              std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_330);
              if (__stream != (FILE *)0x0) {
                fseek(__stream,0,2);
                uVar11 = ftell(__stream);
                local_220._40_4_ = (int)(uVar11 / (ulong)((long)(int)local_220._36_4_ << 2));
                fseek(__stream,0,0);
                sVar16 = (size_t)(int)local_220._40_4_;
                uVar11 = 0xffffffffffffffff;
                if (-1 < (long)sVar16) {
                  uVar11 = sVar16 * 8;
                }
                local_220._56_8_ = operator_new__(uVar11);
                sVar16 = fread((void *)local_220._56_8_,(long)(int)local_220._36_4_ << 2,sVar16,
                               __stream);
                if (local_220._40_4_ != (int)sVar16 || local_220._40_4_ == 0) {
                  if ((float *)local_220._56_8_ != (float *)0x0) {
                    operator_delete__((void *)local_220._56_8_);
                  }
                  local_220._56_8_ = (float *)0x0;
                }
                fclose(__stream);
              }
            }
            rVar12._M_data =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_330 + 0x10);
            if ((float *)local_220._56_8_ == (float *)0x0) {
              aAppDebugPrintf("No raw audio available, continuing in silence");
              local_220._40_4_ = (int)local_150 * local_220._32_4_;
            }
            local_330._0_8_ = rVar12._M_data;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"automation","");
            yaml::Mapping::getMapping
                      ((ExpectedRef<const_Mapping,_std::string> *)local_370,(Mapping *)uVar5,
                       (string *)local_330);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_
                != rVar12._M_data) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            uVar4 = local_370._0_8_;
            if (local_350 == true) {
              rVar2._M_data =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2f0 + 0x10);
              local_2f0._0_8_ = rVar2._M_data;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"type","");
              yaml::Mapping::getString
                        ((ExpectedRef<const_std::string,_std::string> *)local_330,(Mapping *)uVar4,
                         (string *)local_2f0);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_2f0._0_8_ != rVar2._M_data) {
                operator_delete((void *)local_2f0._0_8_,local_2e0._0_8_ + 1);
              }
              __rhs = local_330._0_8_;
              if (local_310 != false) {
                iVar7 = std::__cxx11::string::compare((char *)local_330._0_8_);
                if (iVar7 == 0) {
                  local_220._64_4_ = Rocket;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)__rhs);
                  if (iVar7 == 0) {
                    local_220._64_4_ = Gui;
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare((char *)__rhs);
                    if (iVar7 == 0) {
                      local_220._64_4_ = Basic;
                      pcVar3 = local_2b0 + 0x10;
                      local_2b0._0_8_ = pcVar3;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"file","")
                      ;
                      yaml::Mapping::getString
                                ((ExpectedRef<const_std::string,_std::string> *)local_2f0,
                                 (Mapping *)uVar4,(string *)local_2b0);
                      if ((pointer)local_2b0._0_8_ != pcVar3) {
                        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
                      }
                      bVar6 = local_2e0[0x10];
                      if (local_2e0[0x10] == false) {
                        std::operator+(&local_c8,"Cannot read basic automation file: ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2f0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
                          local_2b0._24_8_ = local_c8.field_2._8_8_;
                          local_c8._M_dataplus._M_p = pcVar3;
                        }
                        else {
                          local_2b0._0_8_ = local_c8._M_dataplus._M_p;
                        }
                        paVar1 = &(in_RDI->field_0).value_.video.config_filename.field_2;
                        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)&in_RDI->field_0 = paVar1;
                        if (local_c8._M_dataplus._M_p == pcVar3) {
                          paVar1->_M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
                          *(undefined8 *)
                           ((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
                               local_2b0._24_8_;
                        }
                        else {
                          (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p =
                               local_c8._M_dataplus._M_p;
                          (in_RDI->field_0).value_.video.config_filename.field_2.
                          _M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
                        }
                        (in_RDI->field_0).value_.video.config_filename._M_string_length =
                             local_c8._M_string_length;
                        in_RDI->has_value_ = false;
                      }
                      else {
                        std::__cxx11::string::_M_assign((string *)&local_1d8);
                      }
                      if ((local_2e0[0x10] == false) &&
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2f0._0_8_ !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_2f0 + 0x10))) {
                        operator_delete((void *)local_2f0._0_8_,local_2e0._0_8_ + 1);
                      }
                      if (bVar6 == false) goto LAB_00127aa3;
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare((char *)__rhs);
                      if (iVar7 != 0) {
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2b0,"Unexpected automation type ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2b0._0_8_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_2b0 + 0x10)) {
                          local_2e0._8_8_ = local_2b0._24_8_;
                          pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(local_2f0 + 0x10);
                        }
                        else {
                          local_2f0._0_8_ = local_2b0._0_8_;
                          pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_2b0._0_8_;
                        }
                        paVar1 = &(in_RDI->field_0).value_.video.config_filename.field_2;
                        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)&in_RDI->field_0 = paVar1;
                        if (pbVar15 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_2f0 + 0x10)) {
                          paVar1->_M_allocated_capacity = local_2b0._16_8_;
                          *(undefined8 *)
                           ((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
                               local_2e0._8_8_;
                        }
                        else {
                          (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p =
                               (pointer)pbVar15;
                          (in_RDI->field_0).value_.video.config_filename.field_2.
                          _M_allocated_capacity = local_2b0._16_8_;
                        }
                        (in_RDI->field_0).value_.video.config_filename._M_string_length =
                             local_2b0._8_8_;
                        goto LAB_00127a9c;
                      }
                    }
                  }
                }
                if ((local_310 == false) &&
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ != rVar12._M_data)) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                goto LAB_00127b1f;
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b0,"Cannot read automation: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_330);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_2b0._0_8_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_2b0 + 0x10)) {
                local_2e0._8_8_ = local_2b0._24_8_;
                rVar13._M_data = rVar2._M_data;
              }
              else {
                local_2f0._0_8_ = local_2b0._0_8_;
                rVar13._M_data =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_2b0._0_8_;
              }
              paVar1 = &(in_RDI->field_0).value_.video.config_filename.field_2;
              *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)&in_RDI->field_0 = paVar1;
              if (rVar13._M_data == rVar2._M_data) {
                paVar1->_M_allocated_capacity = local_2b0._16_8_;
                *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
                     local_2e0._8_8_;
              }
              else {
                (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p =
                     (pointer)rVar13._M_data;
                (in_RDI->field_0).value_.video.config_filename.field_2._M_allocated_capacity =
                     local_2b0._16_8_;
              }
              (in_RDI->field_0).value_.video.config_filename._M_string_length = local_2b0._8_8_;
LAB_00127a9c:
              in_RDI->has_value_ = false;
LAB_00127aa3:
              if ((local_310 == false) &&
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_330._0_8_ != rVar12._M_data)) {
                operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
              }
              if ((local_350 == false) &&
                 ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10))) {
                operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
              }
            }
            else {
LAB_00127b1f:
              if (((local_350 & 1U) == 0) &&
                 ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10))) {
                operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
              }
              local_330._0_8_ = rVar12._M_data;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"export","");
              yaml::Mapping::getMapping
                        ((ExpectedRef<const_Mapping,_std::string> *)local_370,(Mapping *)uVar5,
                         (string *)local_330);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_330._0_8_ != rVar12._M_data) {
                operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
              }
              uVar5 = local_370._0_8_;
              if (local_350 == true) {
                rVar2._M_data =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_2f0 + 0x10);
                local_2f0._0_8_ = rVar2._M_data;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"width","");
                yaml::Mapping::getInt
                          ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_330,(Mapping *)uVar5,(string *)local_2f0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2f0._0_8_ != rVar2._M_data) {
                  operator_delete((void *)local_2f0._0_8_,local_2e0._0_8_ + 1);
                }
                if (local_310 == true) {
                  local_1b8._0_4_ = local_330._0_4_;
                }
                else {
                  aAppDebugPrintf("Cannot read export.width: %s. Continuing with default",
                                  local_330._0_8_);
                }
                if (((local_310 & 1U) == 0) &&
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ != rVar12._M_data)) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                local_2f0._0_8_ = rVar2._M_data;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"height","");
                yaml::Mapping::getInt
                          ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_330,(Mapping *)uVar5,(string *)local_2f0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2f0._0_8_ != rVar2._M_data) {
                  operator_delete((void *)local_2f0._0_8_,local_2e0._0_8_ + 1);
                }
                if (local_310 == true) {
                  local_1b8._4_4_ = local_330._0_4_;
                }
                else {
                  aAppDebugPrintf("Cannot read export.height: %s. Continuing with default",
                                  local_330._0_8_);
                }
                if (((local_310 & 1U) == 0) &&
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ != rVar12._M_data)) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                local_2f0._0_8_ = rVar2._M_data;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"c_source","");
                yaml::Mapping::getString
                          ((ExpectedRef<const_std::string,_std::string> *)local_330,(Mapping *)uVar5
                           ,(string *)local_2f0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2f0._0_8_ != rVar2._M_data) {
                  operator_delete((void *)local_2f0._0_8_,local_2e0._0_8_ + 1);
                }
                if (local_310 == true) {
                  std::__cxx11::string::_M_assign((string *)&local_1b0);
                }
                else {
                  aAppDebugPrintf("Cannot read export.c_source: %s. Continuing with default",
                                  local_330._0_8_);
                }
                if ((local_310 == false) &&
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ != rVar12._M_data)) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                local_2f0._0_8_ = rVar2._M_data;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2f0,"shader_path","");
                yaml::Mapping::getString
                          ((ExpectedRef<const_std::string,_std::string> *)local_330,(Mapping *)uVar5
                           ,(string *)local_2f0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2f0._0_8_ != rVar2._M_data) {
                  operator_delete((void *)local_2f0._0_8_,local_2e0._0_8_ + 1);
                }
                if (local_310 == true) {
                  std::__cxx11::string::_M_assign((string *)&local_190);
                }
                else {
                  aAppDebugPrintf("Cannot read export.shader_path: %s. Continuing with default",
                                  local_330._0_8_);
                }
                if ((local_310 == false) &&
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ != rVar12._M_data)) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                local_2f0._0_8_ = rVar2._M_data;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2f0,"shader_suffix","");
                yaml::Mapping::getString
                          ((ExpectedRef<const_std::string,_std::string> *)local_330,(Mapping *)uVar5
                           ,(string *)local_2f0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2f0._0_8_ != rVar2._M_data) {
                  operator_delete((void *)local_2f0._0_8_,local_2e0._0_8_ + 1);
                }
                if (local_310 == true) {
                  std::__cxx11::string::_M_assign((string *)&local_170);
                }
                else {
                  aAppDebugPrintf("Cannot read export.shader_suffix: %s. Continuing with default",
                                  local_330._0_8_);
                }
                if ((local_310 == false) &&
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ != rVar12._M_data)) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
              }
              else {
                aAppDebugPrintf("Cannot read export section: %s. Continuing with defaults",
                                local_370._0_8_);
              }
              if ((local_350 == false) &&
                 ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10))) {
                operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
              }
              Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Expected(in_RDI,(ProjectSettings *)local_220);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((local_128 == false) &&
             ((undefined1 *)CONCAT44(local_148._4_4_,local_148._0_4_) != local_148 + 0x10)) {
            operator_delete((undefined1 *)CONCAT44(local_148._4_4_,local_148._0_4_),
                            local_148._16_8_ + 1);
          }
        }
        if ((local_250 == '\0') &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                          *)local_270)->error_).error_ + 0x10U))) {
          operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
        }
      }
      if ((local_100 == false) &&
         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_120 + 0x10)))
      {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
    }
    if ((local_228 == '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                      *)local_248)->error_).error_ + 0x10U))) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_p != &local_160) {
      operator_delete(local_170._M_p,
                      CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != &local_180) {
      operator_delete(local_190._M_p,
                      CONCAT71(local_180._M_allocated_capacity._1_7_,local_180._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_p != &local_1a0) {
      operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_p != &local_1c8) {
      operator_delete(local_1d8._M_p,
                      CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]) + 1)
      ;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_220 + 0x10)) {
      operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
    }
  }
  if ((local_d0 == '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                    *)local_f0)->error_).error_ + 0x10U))) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
LAB_00128081:
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_a8.value_);
  return in_RDI;
}

Assistant:

Expected<ProjectSettings, std::string> ProjectSettings::readFromFile(const char *filename) {
	MSG("Reading project settings from file %s", filename);

	const auto top_result = yaml::parse(filename);
	if (!top_result)
		return Unexpected(top_result.error());

	const yaml::Value &top = top_result.value();
	const auto config_result = top.getMapping();
	if (!config_result)
		return Unexpected<std::string>("Top config entity is not an ojbect");
	const yaml::Mapping &config = config_result.value();

	ProjectSettings settings;
	auto map_video_result = config.getMapping("video");
	if (!map_video_result)
		return Unexpected(map_video_result.error());
	auto video_config_result = map_video_result.value().get().getString("config_file");
	if (!video_config_result)
		return Unexpected("Cannot read video config: " + video_config_result.error());
	settings.video.config_filename = video_config_result.value();

	auto map_audio_result = config.getMapping("audio");
	if (!map_audio_result)
		return Unexpected(map_audio_result.error());
	const yaml::Mapping &yaudio = map_audio_result.value();
	auto samplerate_result = yaudio.getInt("samplerate");
	if (!samplerate_result)
		return Unexpected("Error reading samplerate: " + samplerate_result.error());
	settings.audio.samplerate = samplerate_result.value();
	settings.audio.channels = yaudio.getInt("channels", 2);

	const int duration_sec = yaudio.getInt("duration_sec", 120);
	const int bpm = yaudio.getInt("bpm", 60);
	const int rows_per_beat = yaudio.getInt("rows_per_beat", 8);
	const std::string raw_file = yaudio.getString("raw_file", "");

	settings.audio.samples_per_row = settings.audio.samplerate * 60 / (bpm * rows_per_beat);
	settings.audio.samples = 0;

	if (!raw_file.empty()) {
		FILE *f = fopen((fs::path(filename).remove_filename()/raw_file).string().c_str(), "rb");
		if (f) {
			fseek(f, 0L, SEEK_END);
			settings.audio.samples = ftell(f) / (sizeof(float) * settings.audio.channels);
			fseek(f, 0L, SEEK_SET);
			settings.audio.data = new float[settings.audio.samples * 2];
			const int samples_read = fread(settings.audio.data, sizeof(float) * settings.audio.channels, settings.audio.samples, f);
			if (settings.audio.samples != samples_read || !settings.audio.samples) {
				delete[] settings.audio.data;
				settings.audio.data = nullptr;
			}
			fclose(f);
		}
	}

	if (!settings.audio.data) {
		MSG("No raw audio available, continuing in silence");
		settings.audio.samples = settings.audio.samplerate * duration_sec;
	}

	if (auto automation = config.getMapping("automation")) {
		const yaml::Mapping &yautomation = automation.value();
		auto type = yautomation.getString("type");
		if (!type)
			return Unexpected("Cannot read automation: " + type.error());
		const std::string &ytype = type.value();
		if (ytype == "Rocket")
			settings.automation.type = Automation::Type::Rocket;
		else if (ytype == "Gui")
			settings.automation.type = Automation::Type::Gui;
		else if (ytype == "Basic") {
			settings.automation.type = Automation::Type::Basic;
			auto filename = yautomation.getString("file");
			if (!filename)
				return Unexpected("Cannot read basic automation file: " + filename.error());
			settings.automation.filename = filename.value();
		} else if (ytype == "None") {
		} else
			return Unexpected("Unexpected automation type " + ytype);
	}

	if (auto map_export = config.getMapping("export")) {
		const yaml::Mapping &exports = map_export.value();
	#define READ_VALUE(name, getType) \
		if (auto name = exports.getType(#name)) \
			settings.exports.name = name.value(); \
		else \
			MSG("Cannot read export." #name ": %s. Continuing with default", name.error().c_str())

		READ_VALUE(width, getInt);
		READ_VALUE(height, getInt);
		READ_VALUE(c_source, getString);
		READ_VALUE(shader_path, getString);
		READ_VALUE(shader_suffix, getString);
		//READ_VALUE(shader_concat, getInt);
	} else {
		MSG("Cannot read export section: %s. Continuing with defaults", map_export.error().c_str());
	}

	return settings;
}